

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

void __thiscall ON_Triangle::Spin(ON_Triangle *this,uchar move)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dPoint tmp;
  uchar move_local;
  ON_Triangle *this_local;
  
  if ((uint)move % 3 != 0) {
    if ((uint)move % 3 == 1) {
      dVar1 = this->m_V[0].x;
      dVar2 = this->m_V[0].y;
      dVar3 = this->m_V[0].z;
      this->m_V[0].x = this->m_V[2].x;
      this->m_V[0].y = this->m_V[2].y;
      this->m_V[0].z = this->m_V[2].z;
      this->m_V[2].x = this->m_V[1].x;
      this->m_V[2].y = this->m_V[1].y;
      this->m_V[2].z = this->m_V[1].z;
      this->m_V[1].x = dVar1;
      this->m_V[1].y = dVar2;
      this->m_V[1].z = dVar3;
    }
    else {
      dVar1 = this->m_V[0].x;
      dVar2 = this->m_V[0].y;
      dVar3 = this->m_V[0].z;
      this->m_V[0].x = this->m_V[1].x;
      this->m_V[0].y = this->m_V[1].y;
      this->m_V[0].z = this->m_V[1].z;
      this->m_V[1].x = this->m_V[2].x;
      this->m_V[1].y = this->m_V[2].y;
      this->m_V[1].z = this->m_V[2].z;
      this->m_V[2].x = dVar1;
      this->m_V[2].y = dVar2;
      this->m_V[2].z = dVar3;
    }
  }
  return;
}

Assistant:

void ON_Triangle::Spin(unsigned char move)
{
  ON_3dPoint tmp;
  switch (move % 3)
  {
  case 0:
    break;
  case 1:
    tmp = m_V[0];
    m_V[0] = m_V[2];
    m_V[2] = m_V[1];
    m_V[1] = tmp;
    break;
  default: //2
    tmp = m_V[0];
    m_V[0] = m_V[1];
    m_V[1] = m_V[2];
    m_V[2] = tmp;
    break;
  }
}